

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkPrimal.cpp
# Opt level: O0

void __thiscall HEkkPrimal::hyperChooseColumnBasicFeasibilityChange(HEkkPrimal *this)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  reference pvVar4;
  const_reference pvVar5;
  const_reference pvVar6;
  HEkkPrimal *this_00;
  vector<int,_std::allocator<int>_> *this_01;
  const_reference pvVar7;
  long *in_RDI;
  double dual_infeasibility_2;
  HighsInt iCol_2;
  HighsInt iEntry_2;
  vector<int,_std::allocator<int>_> *nonbasic_free_col_set_entry;
  HighsInt *num_nonbasic_free_col;
  double dual_infeasibility_1;
  HighsInt iCol_1;
  HighsInt iRow;
  HighsInt iEntry_1;
  bool use_col_indices;
  double dual_infeasibility;
  HighsInt iCol;
  HighsInt iEntry;
  bool use_row_indices;
  HighsInt to_entry;
  vector<signed_char,_std::allocator<signed_char>_> *nonbasicMove;
  vector<double,_std::allocator<double>_> *workDual;
  HighsInt in_stack_ffffffffffffff78;
  value_type in_stack_ffffffffffffff7c;
  HighsSimplexAnalysis *in_stack_ffffffffffffff80;
  int local_74;
  HighsInt in_stack_ffffffffffffffa4;
  double in_stack_ffffffffffffffa8;
  HEkkPrimal *in_stack_ffffffffffffffb0;
  int local_38;
  int local_24;
  int local_1c;
  vector<signed_char,_std::allocator<signed_char>_> *local_18;
  vector<double,_std::allocator<double>_> *local_10;
  
  if ((*(byte *)(in_RDI + 0x2a) & 1) != 0) {
    HighsSimplexAnalysis::simplexTimerStart
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78);
    local_10 = (vector<double,_std::allocator<double>_> *)(*in_RDI + 0x2578);
    local_18 = (vector<signed_char,_std::allocator<signed_char>_> *)(*in_RDI + 0x29a8);
    bVar2 = HSimplexNla::sparseLoopStyle
                      ((HSimplexNla *)(*in_RDI + 0x2b38),*(HighsInt *)((long)in_RDI + 0x4bc),
                       (HighsInt)in_RDI[2],&local_1c);
    for (local_24 = 0; local_24 < local_1c; local_24 = local_24 + 1) {
      if (bVar2) {
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x98),(long)local_24);
        local_74 = *pvVar4;
      }
      else {
        local_74 = local_24;
      }
      pvVar5 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                         (local_18,(long)local_74);
      in_stack_ffffffffffffff80 = (HighsSimplexAnalysis *)(double)-(int)*pvVar5;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](local_10,(long)local_74);
      if ((double)in_RDI[6] <= (double)in_stack_ffffffffffffff80 * *pvVar6 &&
          (double)in_stack_ffffffffffffff80 * *pvVar6 != (double)in_RDI[6]) {
        hyperChooseColumnChangedInfeasibility
                  (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4);
      }
    }
    bVar2 = HSimplexNla::sparseLoopStyle
                      ((HSimplexNla *)(*in_RDI + 0x2b38),*(HighsInt *)((long)in_RDI + 0x40c),
                       *(HighsInt *)((long)in_RDI + 0x14),&local_1c);
    for (local_38 = 0; local_38 < local_1c; local_38 = local_38 + 1) {
      in_stack_ffffffffffffff7c = local_38;
      if (bVar2) {
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x82),(long)local_38);
        in_stack_ffffffffffffff7c = *pvVar4;
      }
      iVar3 = (int)in_RDI[2] + in_stack_ffffffffffffff7c;
      pvVar5 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                         (local_18,(long)iVar3);
      cVar1 = *pvVar5;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](local_10,(long)iVar3);
      if ((double)in_RDI[6] <= (double)-(int)cVar1 * *pvVar6 &&
          (double)-(int)cVar1 * *pvVar6 != (double)in_RDI[6]) {
        hyperChooseColumnChangedInfeasibility
                  (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4);
      }
    }
    this_00 = (HEkkPrimal *)HSet::count((HSet *)(in_RDI + 0x20));
    if ((*(int *)((long)in_RDI + 0x4c) < 0) && (*(int *)&this_00->ekk_instance_ != 0)) {
      this_01 = HSet::entry((HSet *)(in_RDI + 0x20));
      for (iVar3 = 0; iVar3 < *(int *)&this_00->ekk_instance_; iVar3 = iVar3 + 1) {
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](this_01,(long)iVar3);
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](local_10,(long)*pvVar7);
        if ((double)in_RDI[6] <= ABS(*pvVar6) && ABS(*pvVar6) != (double)in_RDI[6]) {
          hyperChooseColumnChangedInfeasibility(this_00,(double)this_01,iVar3);
        }
      }
    }
    HighsSimplexAnalysis::simplexTimerStop
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78);
  }
  return;
}

Assistant:

void HEkkPrimal::hyperChooseColumnBasicFeasibilityChange() {
  if (!use_hyper_chuzc) return;
  analysis->simplexTimerStart(ChuzcHyperBasicFeasibilityChangeClock);
  const vector<double>& workDual = ekk_instance_.info_.workDual_;
  const vector<int8_t>& nonbasicMove = ekk_instance_.basis_.nonbasicMove_;
  HighsInt to_entry;
  const bool use_row_indices = ekk_instance_.simplex_nla_.sparseLoopStyle(
      row_basic_feasibility_change.count, num_col, to_entry);
  for (HighsInt iEntry = 0; iEntry < to_entry; iEntry++) {
    const HighsInt iCol =
        use_row_indices ? row_basic_feasibility_change.index[iEntry] : iEntry;
    double dual_infeasibility = -nonbasicMove[iCol] * workDual[iCol];
    if (dual_infeasibility > dual_feasibility_tolerance)
      hyperChooseColumnChangedInfeasibility(dual_infeasibility, iCol);
  }
  const bool use_col_indices = ekk_instance_.simplex_nla_.sparseLoopStyle(
      col_basic_feasibility_change.count, num_row, to_entry);
  for (HighsInt iEntry = 0; iEntry < to_entry; iEntry++) {
    const HighsInt iRow =
        use_col_indices ? col_basic_feasibility_change.index[iEntry] : iEntry;
    HighsInt iCol = num_col + iRow;
    double dual_infeasibility = -nonbasicMove[iCol] * workDual[iCol];
    if (dual_infeasibility > dual_feasibility_tolerance)
      hyperChooseColumnChangedInfeasibility(dual_infeasibility, iCol);
  }
  // Any nonbasic free columns will be handled explicitly in
  // hyperChooseColumnDualChange, so only look at them here if not
  // flipping
  const HighsInt& num_nonbasic_free_col = nonbasic_free_col_set.count();
  if (row_out < 0 && num_nonbasic_free_col) {
    const vector<HighsInt>& nonbasic_free_col_set_entry =
        nonbasic_free_col_set.entry();
    for (HighsInt iEntry = 0; iEntry < num_nonbasic_free_col; iEntry++) {
      HighsInt iCol = nonbasic_free_col_set_entry[iEntry];
      double dual_infeasibility = fabs(workDual[iCol]);
      if (dual_infeasibility > dual_feasibility_tolerance)
        hyperChooseColumnChangedInfeasibility(dual_infeasibility, iCol);
    }
  }
  analysis->simplexTimerStop(ChuzcHyperBasicFeasibilityChangeClock);
}